

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# todec.h
# Opt level: O0

void cppcms::impl::todec<long>(long v,char *buf)

{
  undefined1 uVar1;
  undefined1 *in_RSI;
  long in_RDI;
  char tmp;
  char *begin;
  char **in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 *local_18;
  undefined1 *local_10;
  
  if (in_RDI == 0) {
    *in_RSI = 0x30;
    in_RSI[1] = 0;
  }
  else {
    local_18 = (undefined1 *)0x0;
    details::decimal_traits<true>::conv<long>
              (CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,(char **)0x10998d);
    local_10 = in_RSI + -1;
    *in_RSI = 0;
    for (; local_18 < local_10; local_18 = local_18 + 1) {
      uVar1 = *local_18;
      *local_18 = *local_10;
      *local_10 = uVar1;
      local_10 = local_10 + -1;
    }
  }
  return;
}

Assistant:

void todec(Integer v,char *buf)
		{
			typedef std::numeric_limits<Integer> limits;
			if(v == 0) {
				*buf++ = '0';
				*buf++ = 0;
				return;
			}
			char *begin=0;

			details::decimal_traits<limits::is_signed>::conv(v,begin,buf);
			
			*buf-- = 0;
			while(begin < buf) {
				char tmp = *begin;
				*begin = *buf;
				*buf = tmp;
				buf--;
				begin++;
			}
		}